

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionCordAccessorsTest_GetOneofCord_Test::
TestBody(GeneratedMessageReflectionCordAccessorsTest_GetOneofCord_Test *this)

{
  bool bVar1;
  FooCase FVar2;
  Descriptor *this_00;
  Reflection *message_00;
  char *pcVar3;
  Arena *pAVar4;
  AssertHelper local_170;
  Message local_168;
  string_view local_160;
  undefined1 local_150 [16];
  undefined1 local_140 [8];
  AssertionResult gtest_ar_2;
  Message local_128;
  string_view local_120;
  undefined1 local_110 [16];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8;
  string_view local_e0;
  undefined1 local_d0 [16];
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  Reflection *reflection;
  Descriptor *descriptor;
  TestOneof2 message;
  GeneratedMessageReflectionCordAccessorsTest_GetOneofCord_Test *this_local;
  
  message.field_0._impl_._oneof_case_ = (uint32_t  [2])this;
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)&descriptor);
  this_00 = proto2_unittest::TestOneof2::descriptor();
  message_00 = proto2_unittest::TestOneof2::GetReflection();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"bytes_cord");
  proto2_unittest::TestOneof2::set_foo_bytes_cord((TestOneof2 *)&descriptor,stack0xffffffffffffff50)
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e0,"foo_bytes_cord");
  Descriptor::FindFieldByName(this_00,local_e0);
  Reflection::GetCord((Reflection *)local_d0,(Message *)message_00,(FieldDescriptor *)&descriptor);
  testing::internal::EqHelper::Compare<char[11],_absl::lts_20250127::Cord,_nullptr>
            ((EqHelper *)local_c0,"\"bytes_cord\"",
             "reflection->GetCord(message, descriptor->FindFieldByName(\"foo_bytes_cord\"))",
             (char (*) [11])0x1d5be23,(Cord *)local_d0);
  absl::lts_20250127::Cord::~Cord((Cord *)local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x621,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  FVar2 = proto2_unittest::TestOneof2::foo_case((TestOneof2 *)&descriptor);
  if (FVar2 != kFooString) {
    proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)&descriptor);
    proto2_unittest::TestOneof2::set_has_foo_string((TestOneof2 *)&descriptor);
    internal::ArenaStringPtr::InitDefault((ArenaStringPtr *)((long)&message.field_0 + 0x10));
  }
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)&descriptor);
  internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)&message.field_0 + 0x10),"foo",pAVar4);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_120,"foo_string");
  Descriptor::FindFieldByName(this_00,local_120);
  Reflection::GetCord((Reflection *)local_110,(Message *)message_00,(FieldDescriptor *)&descriptor);
  testing::internal::EqHelper::Compare<char[4],_absl::lts_20250127::Cord,_nullptr>
            ((EqHelper *)local_100,"\"foo\"",
             "reflection->GetCord( message, descriptor->FindFieldByName(\"foo_string\"))",
             (char (*) [4])0x1d63234,(Cord *)local_110);
  absl::lts_20250127::Cord::~Cord((Cord *)local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x625,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  FVar2 = proto2_unittest::TestOneof2::foo_case((TestOneof2 *)&descriptor);
  if (FVar2 != kFooBytes) {
    proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)&descriptor);
    proto2_unittest::TestOneof2::set_has_foo_bytes((TestOneof2 *)&descriptor);
    internal::ArenaStringPtr::InitDefault((ArenaStringPtr *)((long)&message.field_0 + 0x10));
  }
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)&descriptor);
  internal::ArenaStringPtr::SetBytes
            ((ArenaStringPtr *)((long)&message.field_0 + 0x10),"bytes",pAVar4);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160,"foo_bytes");
  Descriptor::FindFieldByName(this_00,local_160);
  Reflection::GetCord((Reflection *)local_150,(Message *)message_00,(FieldDescriptor *)&descriptor);
  testing::internal::EqHelper::Compare<char[6],_absl::lts_20250127::Cord,_nullptr>
            ((EqHelper *)local_140,"\"bytes\"",
             "reflection->GetCord( message, descriptor->FindFieldByName(\"foo_bytes\"))",
             (char (*) [6])0x1f01fde,(Cord *)local_150);
  absl::lts_20250127::Cord::~Cord((Cord *)local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x629,pcVar3);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)&descriptor);
  return;
}

Assistant:

TEST_F(GeneratedMessageReflectionCordAccessorsTest, GetOneofCord) {
  unittest::TestOneof2 message;
  const Descriptor* descriptor = unittest::TestOneof2::descriptor();
  const Reflection* reflection = message.GetReflection();

  message.set_foo_bytes_cord("bytes_cord");
  EXPECT_EQ("bytes_cord",
            reflection->GetCord(message,
                                descriptor->FindFieldByName("foo_bytes_cord")));

  message.set_foo_string("foo");
  EXPECT_EQ("foo", reflection->GetCord(
                       message, descriptor->FindFieldByName("foo_string")));

  message.set_foo_bytes("bytes");
  EXPECT_EQ("bytes", reflection->GetCord(
                         message, descriptor->FindFieldByName("foo_bytes")));

}